

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::InvocationCountShader::InvocationCountShader
          (InvocationCountShader *this,ContextType *contextType,int numInvocations,
          OutputCase testCase)

{
  ShaderProgramDeclaration *pSVar1;
  size_t numOutputVertices_;
  OutputCase testCase_00;
  size_t numInvocations_;
  string local_318;
  GeometrySource local_2f8;
  GeometryShaderDeclaration local_2d8;
  allocator<char> local_2b9;
  string local_2b8;
  string local_298;
  FragmentSource local_278;
  allocator<char> local_251;
  string local_250;
  string local_230;
  VertexSource local_210;
  FragmentOutput local_1f0;
  GeometryToFragmentVarying local_1ec;
  VertexToGeometryVarying local_1e4;
  allocator<char> local_1d9;
  string local_1d8;
  VertexAttribute local_1b8;
  allocator<char> local_179;
  string local_178;
  VertexAttribute local_158;
  ShaderProgramDeclaration local_130;
  OutputCase local_20;
  uint local_1c;
  OutputCase testCase_local;
  int numInvocations_local;
  ContextType *contextType_local;
  InvocationCountShader *this_local;
  
  local_20 = testCase;
  local_1c = numInvocations;
  _testCase_local = (InvocationCountShader *)contextType;
  contextType_local = (ContextType *)this;
  sglr::pdec::ShaderProgramDeclaration::ShaderProgramDeclaration(&local_130);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_178,"a_position",&local_179);
  sglr::pdec::VertexAttribute::VertexAttribute(&local_158,&local_178,GENERICVECTYPE_FLOAT);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(&local_130,&local_158);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,"a_color",&local_1d9);
  sglr::pdec::VertexAttribute::VertexAttribute(&local_1b8,&local_1d8,GENERICVECTYPE_FLOAT);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_1b8);
  sglr::pdec::VertexToGeometryVarying::VertexToGeometryVarying(&local_1e4,GENERICVECTYPE_FLOAT,0);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_1e4);
  sglr::pdec::GeometryToFragmentVarying::GeometryToFragmentVarying
            (&local_1ec,GENERICVECTYPE_FLOAT,0);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_1ec);
  sglr::pdec::FragmentOutput::FragmentOutput(&local_1f0,GENERICVECTYPE_FLOAT);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_1f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_250,
             "${GLSL_VERSION_DECL}\nin highp vec4 a_position;\nin highp vec4 a_color;\nout highp vec4 v_geom_FragColor;\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tgl_PointSize = 1.0;\n\tv_geom_FragColor = a_color;\n}\n"
             ,&local_251);
  specializeShader(&local_230,&local_250,(ContextType *)_testCase_local);
  sglr::pdec::VertexSource::VertexSource(&local_210,&local_230);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_210);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2b8,
             "${GLSL_VERSION_DECL}\nlayout(location = 0) out mediump vec4 fragColor;\nin mediump vec4 v_frag_FragColor;\nvoid main (void)\n{\n\tfragColor = v_frag_FragColor;\n}\n"
             ,&local_2b9);
  specializeShader(&local_298,&local_2b8,(ContextType *)_testCase_local);
  sglr::pdec::FragmentSource::FragmentSource(&local_278,&local_298);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_278);
  numOutputVertices_ = getNumVertices(local_1c,local_20);
  numInvocations_ = (size_t)(int)local_1c;
  sglr::pdec::GeometryShaderDeclaration::GeometryShaderDeclaration
            (&local_2d8,GEOMETRYSHADERINPUTTYPE_POINTS,GEOMETRYSHADEROUTPUTTYPE_TRIANGLE_STRIP,
             numOutputVertices_,numInvocations_);
  testCase_00 = (OutputCase)numInvocations_;
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_2d8);
  Functional::(anonymous_namespace)::InvocationCountShader::genGeometrySource_abi_cxx11_
            (&local_318,_testCase_local,(ContextType *)(ulong)local_1c,local_20,testCase_00);
  sglr::pdec::GeometrySource::GeometrySource(&local_2f8,&local_318);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_2f8);
  sglr::ShaderProgram::ShaderProgram(&this->super_ShaderProgram,pSVar1);
  sglr::pdec::GeometrySource::~GeometrySource(&local_2f8);
  std::__cxx11::string::~string((string *)&local_318);
  sglr::pdec::FragmentSource::~FragmentSource(&local_278);
  std::__cxx11::string::~string((string *)&local_298);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::allocator<char>::~allocator(&local_2b9);
  sglr::pdec::VertexSource::~VertexSource(&local_210);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_250);
  std::allocator<char>::~allocator(&local_251);
  sglr::pdec::VertexAttribute::~VertexAttribute(&local_1b8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::allocator<char>::~allocator(&local_1d9);
  sglr::pdec::VertexAttribute::~VertexAttribute(&local_158);
  std::__cxx11::string::~string((string *)&local_178);
  std::allocator<char>::~allocator(&local_179);
  sglr::pdec::ShaderProgramDeclaration::~ShaderProgramDeclaration(&local_130);
  (this->super_ShaderProgram).super_VertexShader._vptr_VertexShader =
       (_func_int **)&PTR_shadeVertices_032bdee0;
  (this->super_ShaderProgram).super_GeometryShader._vptr_GeometryShader =
       (_func_int **)&DAT_032bdf18;
  (this->super_ShaderProgram).super_FragmentShader._vptr_FragmentShader =
       (_func_int **)&DAT_032bdf30;
  *(uint *)&(this->super_ShaderProgram).field_0x154 = local_1c;
  this->m_testCase = local_20;
  return;
}

Assistant:

InvocationCountShader::InvocationCountShader (const glu::ContextType& contextType, int numInvocations, OutputCase testCase)
	: sglr::ShaderProgram	(sglr::pdec::ShaderProgramDeclaration()
							<< sglr::pdec::VertexAttribute("a_position", rr::GENERICVECTYPE_FLOAT)
							<< sglr::pdec::VertexAttribute("a_color", rr::GENERICVECTYPE_FLOAT)
							<< sglr::pdec::VertexToGeometryVarying(rr::GENERICVECTYPE_FLOAT)
							<< sglr::pdec::GeometryToFragmentVarying(rr::GENERICVECTYPE_FLOAT)
							<< sglr::pdec::FragmentOutput(rr::GENERICVECTYPE_FLOAT)
							<< sglr::pdec::VertexSource(specializeShader(s_commonShaderSourceVertex, contextType))
							<< sglr::pdec::FragmentSource(specializeShader(s_commonShaderSourceFragment, contextType))
							<< sglr::pdec::GeometryShaderDeclaration(rr::GEOMETRYSHADERINPUTTYPE_POINTS,
																	 rr::GEOMETRYSHADEROUTPUTTYPE_TRIANGLE_STRIP,
																	 getNumVertices(numInvocations, testCase),
																	 numInvocations)
							<< sglr::pdec::GeometrySource(genGeometrySource(contextType, numInvocations, testCase)))
	, m_numInvocations		(numInvocations)
	, m_testCase			(testCase)
{
}